

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * __thiscall FSerializer::StringPtr(FSerializer *this,char *key,char **charptr)

{
  bool bVar1;
  Value *this_00;
  Ch *cc;
  char *pcVar2;
  Value *val;
  char **charptr_local;
  char *key_local;
  FSerializer *this_local;
  
  bVar1 = isWriting(this);
  if (bVar1) {
    WriteKey(this,key);
    if (*charptr == (char *)0x0) {
      FWriter::Null(this->w);
    }
    else {
      FWriter::String(this->w,*charptr);
    }
  }
  else {
    this_00 = FReader::FindKey(this->r,key);
    if (this_00 != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString(this_00);
      if (bVar1) {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
        pcVar2 = UnicodeToString(cc);
        *charptr = pcVar2;
      }
      else {
        *charptr = (char *)0x0;
      }
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::StringPtr(const char *key, const char *&charptr)
{
	if (isWriting())
	{
		WriteKey(key);
		if (charptr != nullptr)
			w->String(charptr);
		else
			w->Null();
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				charptr = UnicodeToString(val->GetString());
			}
			else
			{
				charptr = nullptr;
			}
		}
	}
	return *this;
}